

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_codebook_task(dxt_hc *this,uint64 data,void *param_2)

{
  color_quad_u8 *pcVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  color_cluster *pcVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  byte bVar16;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint p;
  color_quad_u8 color_values [4];
  vector<unsigned_char> selectors;
  color_quad_u8 block_values [4];
  params params;
  params refinerParams;
  results results;
  results refinerResults;
  dxt_endpoint_refiner refiner;
  float encoding_weight [8];
  dxt1_endpoint_optimizer optimizer;
  byte local_b28 [16];
  color_cluster *local_b18;
  uint local_b0c;
  elemental_vector local_b08;
  dxt_hc *local_af8;
  ulong local_af0;
  color_quad_u8 local_ae8 [4];
  params local_ad8;
  params local_ab0;
  ulong local_a78;
  unsigned_long_long *local_a70;
  uchar *local_a68;
  float *local_a60;
  uint *local_a58;
  ulong local_a50;
  ulong local_a48;
  color_quad_u8 (*local_a40) [16];
  results local_a38;
  results local_a18;
  dxt_endpoint_refiner local_a08;
  float afStack_9f8 [10];
  dxt1_endpoint_optimizer local_9d0;
  ulong uVar17;
  
  local_b0c = this->m_pTask_pool->m_num_threads;
  dxt1_endpoint_optimizer::dxt1_endpoint_optimizer(&local_9d0);
  dxt_endpoint_refiner::dxt_endpoint_refiner(&local_a08);
  local_b08.m_p = (uint8 *)0x0;
  local_b08.m_size = 0;
  local_b08.m_capacity = 0;
  if ((uint)data < (this->m_color_clusters).m_size) {
    local_b0c = local_b0c + 1;
    local_af8 = this;
    do {
      uVar14 = (uint)data;
      uVar10 = data & 0xffffffff;
      pcVar5 = (this->m_color_clusters).m_p;
      if (pcVar5[uVar10].pixels.m_size != 0) {
        local_b18 = pcVar5 + uVar10;
        local_ad8.m_force_alpha_blocks = false;
        local_ad8.m_pPixels = (local_b18->pixels).m_p;
        uVar7 = (local_b18->pixels).m_size;
        local_ad8.m_dxt1a_alpha_threshold = 0x80;
        local_ad8.m_num_pixels = uVar7;
        local_ad8._24_8_ = (ulong)(this->m_params).m_perceptual << 0x30;
        local_ad8.m_quality = cCRNDXTQualityUber;
        local_ad8.m_endpoint_caching = false;
        local_ad8.m_use_transparent_indices_for_black = false;
        local_a38.m_pSelectors = (uint8 *)0x0;
        local_ad8.m_block_index = uVar14;
        if (local_b08.m_size != uVar7) {
          if (local_b08.m_size <= uVar7) {
            if (local_b08.m_capacity < uVar7) {
              elemental_vector::increase_capacity
                        (&local_b08,uVar7,local_b08.m_size + 1 == uVar7,1,(object_mover)0x0,false);
            }
            memset((uint8 *)((long)local_b08.m_p + (local_b08._8_8_ & 0xffffffff)),0,
                   (ulong)(uVar7 - local_b08.m_size));
          }
          local_b08.m_size = uVar7;
        }
        local_a38.m_pSelectors = (uint8 *)local_b08.m_p;
        dxt1_endpoint_optimizer::compute(&local_9d0,&local_ad8,&local_a38);
        local_b18->first_endpoint = (uint)local_a38.m_low_color;
        local_b18->second_endpoint = (uint)local_a38.m_high_color;
        dxt1_block::get_block_colors4
                  (local_ae8,(uint16)local_b18->first_endpoint,(uint16)local_b18->second_endpoint);
        lVar9 = 0;
        do {
          bVar16 = (&g_dxt1_from_linear)[lVar9];
          bVar2 = local_ae8[bVar16].field_0.field_0.r;
          pcVar5[uVar10].color_values[lVar9].field_0.field_0.r = bVar2;
          bVar3 = local_ae8[bVar16].field_0.field_0.g;
          pcVar5[uVar10].color_values[lVar9].field_0.field_0.g = bVar3;
          bVar4 = local_ae8[bVar16].field_0.field_0.b;
          pcVar5[uVar10].color_values[lVar9].field_0.field_0.b = bVar4;
          bVar16 = local_ae8[bVar16].field_0.field_0.a;
          pcVar5[uVar10].color_values[lVar9].field_0.field_0.a = bVar16;
          local_b28[lVar9 * 4] = bVar2;
          local_b28[lVar9 * 4 + 1] = bVar3;
          local_b28[lVar9 * 4 + 2] = bVar4;
          local_b28[lVar9 * 4 + 3] = bVar16;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        if (local_a38.m_alternate_rounding == true) {
          uVar10 = 0;
          while( true ) {
            local_b28[uVar10 + 4] =
                 (byte)(((uint)local_b28[uVar10 + 0xc] + (uint)local_b28[uVar10] * 2 + 1) / 3);
            local_b28[uVar10 + 8] =
                 (byte)(((uint)local_b28[uVar10] + (uint)local_b28[uVar10 + 0xc] * 2 + 1) / 3);
            if (1 < uVar10) break;
            uVar10 = uVar10 + 1;
          }
        }
        local_ab0.m_perceptual = (this->m_params).m_perceptual;
        iVar11 = (uint)local_b28[0] - (uint)local_b28[0xc];
        if (local_ab0.m_perceptual == true) {
          uVar7 = ((uint)local_b28[2] - (uint)local_b28[0xe]) *
                  ((uint)local_b28[2] - (uint)local_b28[0xe]) +
                  ((uint)local_b28[1] - (uint)local_b28[0xd]) *
                  ((uint)local_b28[1] - (uint)local_b28[0xd]) * 0x19 + iVar11 * iVar11 * 8;
        }
        else {
          uVar7 = ((uint)local_b28[2] - (uint)local_b28[0xe]) *
                  ((uint)local_b28[2] - (uint)local_b28[0xe]) +
                  ((uint)local_b28[1] - (uint)local_b28[0xd]) *
                  ((uint)local_b28[1] - (uint)local_b28[0xd]) + iVar11 * iVar11;
        }
        local_a78 = data;
        data = local_a78;
        lVar9 = 0;
        do {
          afStack_9f8[lVar9] = ((float)(int)lVar9 / 7.0) * -0.14999998 + 1.15;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 8);
        local_a50 = (ulong)local_b18->blocks[0].m_size;
        if (local_a50 != 0) {
          local_a58 = local_b18->blocks[0].m_p;
          local_a40 = local_af8->m_blocks;
          local_a60 = (local_af8->m_block_weights).m_p;
          local_a68 = (local_af8->m_block_encodings).m_p;
          local_a70 = local_af8->m_block_selectors[0].m_p;
          uVar10 = 0;
          do {
            local_a48 = uVar10;
            local_af0 = (ulong)local_a58[uVar10];
            uVar20 = (uint)(long)(local_a60[local_af0] * (float)(uVar7 / 2000));
            uVar12 = 0x800;
            if (uVar20 < 0x800) {
              uVar12 = uVar20;
            }
            if (uVar20 == 0) {
              uVar12 = 1;
            }
            lVar9 = 0;
            uVar20 = 0;
            do {
              pcVar1 = local_a40[local_af0] + lVar9;
              uVar8 = 0xffffffff;
              lVar13 = 0;
              uVar15 = 0;
              do {
                bVar16 = 3 - (&g_dxt1_to_linear)[lVar13];
                if (local_a38.m_reordered == false) {
                  bVar16 = (&g_dxt1_to_linear)[lVar13];
                }
                uVar17 = (ulong)bVar16;
                iVar11 = (uint)(pcVar1->field_0).field_0.r - (uint)local_b28[uVar17 * 4];
                if (local_ab0.m_perceptual == false) {
                  iVar21 = (uint)(pcVar1->field_0).field_0.g - (uint)local_b28[uVar17 * 4 + 1];
                  iVar18 = (uint)(pcVar1->field_0).field_0.b - (uint)local_b28[uVar17 * 4 + 2];
                  uVar19 = iVar18 * iVar18 + iVar21 * iVar21 + iVar11 * iVar11;
                }
                else {
                  iVar21 = (uint)(pcVar1->field_0).field_0.g - (uint)local_b28[uVar17 * 4 + 1];
                  iVar18 = (uint)(pcVar1->field_0).field_0.b - (uint)local_b28[uVar17 * 4 + 2];
                  uVar19 = iVar18 * iVar18 + iVar21 * iVar21 * 0x19 + iVar11 * iVar11 * 8;
                }
                if (uVar19 < uVar8) {
                  uVar15 = uVar17;
                  uVar8 = uVar19;
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 != 4);
              uVar20 = (uint)uVar15 | uVar20 << 2;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0x10);
            local_a70[local_af0] =
                 (long)((float)(int)uVar12 * afStack_9f8[local_a68[local_af0]]) & 0xffffffffU |
                 (ulong)uVar20 << 0x20;
            uVar10 = uVar10 + 1;
          } while (uVar10 != local_a50);
        }
        local_ab0.m_alpha_comp_index = 0;
        local_ab0.m_highest_quality = true;
        local_ab0.m_pSelectors = (uint8 *)local_b08.m_p;
        local_ab0.m_pPixels = (local_b18->pixels).m_p;
        local_ab0.m_num_pixels = (local_b18->pixels).m_size;
        local_ab0.m_dxt1_selectors = true;
        local_ab0.m_error_to_beat = local_a38.m_error;
        local_ab0.m_block_index = uVar14;
        bVar6 = dxt_endpoint_refiner::refine(&local_a08,&local_ab0,&local_a18);
        this = local_af8;
        if (bVar6) {
          local_b18->first_endpoint = (uint)local_a18.m_low_color;
          local_b18->second_endpoint = (uint)local_a18.m_high_color;
        }
      }
      uVar7 = (int)data + local_b0c;
      data = (uint64)uVar7;
    } while (uVar7 < (this->m_color_clusters).m_size);
  }
  if ((uint8 *)local_b08.m_p != (uint8 *)0x0) {
    crnlib_free(local_b08.m_p);
  }
  dxt1_endpoint_optimizer::~dxt1_endpoint_optimizer(&local_9d0);
  return;
}

Assistant:

void dxt_hc::determine_color_endpoint_codebook_task(uint64 data, void*)
    {
        const uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        dxt1_endpoint_optimizer optimizer;
        dxt_endpoint_refiner refiner;
        crnlib::vector<uint8> selectors;

        for (uint cluster_index = (uint)data; cluster_index < m_color_clusters.size(); cluster_index += num_tasks)
        {
            color_cluster& cluster = m_color_clusters[cluster_index];
            if (cluster.pixels.empty())
            {
                continue;
            }

            dxt1_endpoint_optimizer::params params;
            params.m_block_index = cluster_index;
            params.m_pPixels = cluster.pixels.get_ptr();
            params.m_num_pixels = cluster.pixels.size();
            params.m_pixels_have_alpha = false;
            params.m_use_alpha_blocks = false;
            params.m_perceptual = m_params.m_perceptual;
            params.m_quality = cCRNDXTQualityUber;
            params.m_endpoint_caching = false;

            dxt1_endpoint_optimizer::results results;
            selectors.resize(params.m_num_pixels);
            results.m_pSelectors = selectors.get_ptr();

            optimizer.compute(params, results);
            cluster.first_endpoint = results.m_low_color;
            cluster.second_endpoint = results.m_high_color;
            color_quad_u8 block_values[4], color_values[4];
            dxt1_block::get_block_colors4(block_values, cluster.first_endpoint, cluster.second_endpoint);
            for (uint i = 0; i < 4; i++)
            {
                color_values[i] = cluster.color_values[i] = block_values[g_dxt1_from_linear[i]];
            }
            for (uint c = 0; results.m_alternate_rounding && c < 3; c++)
            {
                color_values[1].c[c] = ((color_values[0].c[c] << 1) + color_values[3].c[c] + 1) / 3;
                color_values[2].c[c] = ((color_values[3].c[c] << 1) + color_values[0].c[c] + 1) / 3;
            }

            uint endpoint_weight = color::color_distance(m_params.m_perceptual, color_values[0], color_values[3], false) / 2000;
            float encoding_weight[8];
            for (uint i = 0; i < 8; i++)
            {
                encoding_weight[i] = math::lerp(1.15f, 1.0f, i / 7.0f);
            }

            crnlib::vector<uint>& blocks = cluster.blocks[cColor];
            for (uint i = 0; i < blocks.size(); i++)
            {
                uint b = blocks[i];
                uint weight = (uint)(math::clamp<uint>(endpoint_weight * m_block_weights[b], 1, 2048) * encoding_weight[m_block_encodings[b]]);
                uint32 selector = 0;
                for (uint p = 0; p < 16; p++)
                {
                    uint error_best = cUINT32_MAX;
                    uint8 s_best = 0;
                    for (uint8 t = 0; t < 4; t++)
                    {
                        uint8 s = results.m_reordered ? 3 - g_dxt1_to_linear[t] : g_dxt1_to_linear[t];
                        uint error = color::color_distance(m_params.m_perceptual, (color_quad_u8&)m_blocks[b][p], color_values[s], false);
                        if (error < error_best)
                        {
                            s_best = s;
                            error_best = error;
                        }
                    }
                    selector = selector << 2 | s_best;
                }
                m_block_selectors[cColor][b] = (uint64)selector << 32 | weight;
            }

            dxt_endpoint_refiner::params refinerParams;
            dxt_endpoint_refiner::results refinerResults;
            refinerParams.m_perceptual = m_params.m_perceptual;
            refinerParams.m_pSelectors = selectors.get_ptr();
            refinerParams.m_pPixels = cluster.pixels.get_ptr();
            refinerParams.m_num_pixels = cluster.pixels.size();
            refinerParams.m_dxt1_selectors = true;
            refinerParams.m_error_to_beat = results.m_error;
            refinerParams.m_block_index = cluster_index;
            if (refiner.refine(refinerParams, refinerResults))
            {
                cluster.first_endpoint = refinerResults.m_low_color;
                cluster.second_endpoint = refinerResults.m_high_color;
            }
        }
    }